

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O1

anon_class_40_5_d6c92a71_conflict * __thiscall
qclab::qgates::lambda_QGate1<std::complex<float>>
          (anon_class_40_5_d6c92a71_conflict *__return_storage_ptr__,qgates *this,Op op,
          SquareMatrix<std::complex<float>_> *mat1,complex<float> *vector)

{
  complex<float> *pcVar1;
  _ComplexT _Var2;
  _ComplexT _Var3;
  _ComplexT _Var4;
  _ComplexT _Var5;
  undefined7 in_register_00000011;
  SquareMatrix<std::complex<float>_> *A;
  
  A = (SquareMatrix<std::complex<float>_> *)CONCAT71(in_register_00000011,op);
  if (A->size_ == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>((Op)this,A);
    pcVar1 = (A->data_)._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    _Var2 = pcVar1->_M_value;
    _Var3 = pcVar1[1]._M_value;
    _Var4 = pcVar1[A->size_]._M_value;
    _Var5 = (pcVar1 + 1)[A->size_]._M_value;
    __return_storage_ptr__->vector = (complex<float> *)mat1;
    (__return_storage_ptr__->m11)._M_value = _Var2;
    (__return_storage_ptr__->m12)._M_value = _Var4;
    (__return_storage_ptr__->m21)._M_value = _Var3;
    (__return_storage_ptr__->m22)._M_value = _Var5;
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = std::complex<float>]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }